

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O2

void __thiscall Catch::ConsoleReporter::lazyPrintRunInfo(ConsoleReporter *this)

{
  int iVar1;
  ulong in_RAX;
  ostream *poVar2;
  ulong uStack_18;
  Colour colour;
  
  uStack_18 = in_RAX;
  poVar2 = std::operator<<((this->super_StreamingReporterBase<Catch::ConsoleReporter>).stream,'\n');
  if (getLineOfChars<(char)126>()::line == '\0') {
    uRam000000000019a250 = 0x7e7e7e7e7e7e7e;
    uRam000000000019a257._0_1_ = '~';
    uRam000000000019a257._1_1_ = '~';
    uRam000000000019a257._2_1_ = '~';
    uRam000000000019a257._3_1_ = '~';
    uRam000000000019a257._4_1_ = '~';
    uRam000000000019a257._5_1_ = '~';
    uRam000000000019a257._6_1_ = '~';
    uRam000000000019a257._7_1_ = '~';
    DAT_0019a240 = '~';
    DAT_0019a240_1._0_1_ = '~';
    DAT_0019a240_1._1_1_ = '~';
    DAT_0019a240_1._2_1_ = '~';
    DAT_0019a240_1._3_1_ = '~';
    DAT_0019a240_1._4_1_ = '~';
    DAT_0019a240_1._5_1_ = '~';
    DAT_0019a240_1._6_1_ = '~';
    uRam000000000019a248 = 0x7e7e7e7e7e7e7e;
    DAT_0019a24f = 0x7e;
    DAT_0019a230 = '~';
    DAT_0019a230_1._0_1_ = '~';
    DAT_0019a230_1._1_1_ = '~';
    DAT_0019a230_1._2_1_ = '~';
    DAT_0019a230_1._3_1_ = '~';
    DAT_0019a230_1._4_1_ = '~';
    DAT_0019a230_1._5_1_ = '~';
    DAT_0019a230_1._6_1_ = '~';
    uRam000000000019a238._0_1_ = '~';
    uRam000000000019a238._1_1_ = '~';
    uRam000000000019a238._2_1_ = '~';
    uRam000000000019a238._3_1_ = '~';
    uRam000000000019a238._4_1_ = '~';
    uRam000000000019a238._5_1_ = '~';
    uRam000000000019a238._6_1_ = '~';
    uRam000000000019a238._7_1_ = '~';
    DAT_0019a220 = '~';
    DAT_0019a220_1._0_1_ = '~';
    DAT_0019a220_1._1_1_ = '~';
    DAT_0019a220_1._2_1_ = '~';
    DAT_0019a220_1._3_1_ = '~';
    DAT_0019a220_1._4_1_ = '~';
    DAT_0019a220_1._5_1_ = '~';
    DAT_0019a220_1._6_1_ = '~';
    uRam000000000019a228._0_1_ = '~';
    uRam000000000019a228._1_1_ = '~';
    uRam000000000019a228._2_1_ = '~';
    uRam000000000019a228._3_1_ = '~';
    uRam000000000019a228._4_1_ = '~';
    uRam000000000019a228._5_1_ = '~';
    uRam000000000019a228._6_1_ = '~';
    uRam000000000019a228._7_1_ = '~';
    getLineOfChars<(char)126>()::line = '~';
    getLineOfChars<(char)126>()::line_1._0_1_ = '~';
    getLineOfChars<(char)126>()::line_1._1_1_ = '~';
    getLineOfChars<(char)126>()::line_1._2_1_ = '~';
    getLineOfChars<(char)126>()::line_1._3_1_ = '~';
    getLineOfChars<(char)126>()::line_1._4_1_ = '~';
    getLineOfChars<(char)126>()::line_1._5_1_ = '~';
    getLineOfChars<(char)126>()::line_1._6_1_ = '~';
    uRam000000000019a218._0_1_ = '~';
    uRam000000000019a218._1_1_ = '~';
    uRam000000000019a218._2_1_ = '~';
    uRam000000000019a218._3_1_ = '~';
    uRam000000000019a218._4_1_ = '~';
    uRam000000000019a218._5_1_ = '~';
    uRam000000000019a218._6_1_ = '~';
    uRam000000000019a218._7_1_ = '~';
    DAT_0019a25f = 0;
  }
  poVar2 = std::operator<<(poVar2,&getLineOfChars<(char)126>()::line);
  std::operator<<(poVar2,'\n');
  uStack_18 = uStack_18 & 0xffffffffffffff;
  Colour::use(FileName);
  poVar2 = std::operator<<((this->super_StreamingReporterBase<Catch::ConsoleReporter>).stream,
                           (string *)
                           (this->super_StreamingReporterBase<Catch::ConsoleReporter>).
                           currentTestRunInfo.super_Option<Catch::TestRunInfo>.nullableValue);
  poVar2 = std::operator<<(poVar2," is a Catch v");
  libraryVersion();
  Catch::operator<<(poVar2,&libraryVersion::version);
  poVar2 = std::operator<<(poVar2," host application.\n");
  std::operator<<(poVar2,"Run with -? for options\n\n");
  iVar1 = (*(((this->super_StreamingReporterBase<Catch::ConsoleReporter>).m_config.
              super___shared_ptr<const_Catch::IConfig,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
            super_NonCopyable)._vptr_NonCopyable[0x11])();
  if (iVar1 != 0) {
    poVar2 = std::operator<<((this->super_StreamingReporterBase<Catch::ConsoleReporter>).stream,
                             "Randomness seeded to: ");
    (*(((this->super_StreamingReporterBase<Catch::ConsoleReporter>).m_config.
        super___shared_ptr<const_Catch::IConfig,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
      super_NonCopyable)._vptr_NonCopyable[0x11])();
    poVar2 = std::ostream::_M_insert<unsigned_long>((ulong)poVar2);
    std::operator<<(poVar2,"\n\n");
  }
  (this->super_StreamingReporterBase<Catch::ConsoleReporter>).currentTestRunInfo.used = true;
  Colour::~Colour(&colour);
  return;
}

Assistant:

void ConsoleReporter::lazyPrintRunInfo() {
    stream << '\n' << getLineOfChars<'~'>() << '\n';
    Colour colour(Colour::SecondaryText);
    stream << currentTestRunInfo->name
        << " is a Catch v" << libraryVersion() << " host application.\n"
        << "Run with -? for options\n\n";

    if (m_config->rngSeed() != 0)
        stream << "Randomness seeded to: " << m_config->rngSeed() << "\n\n";

    currentTestRunInfo.used = true;
}